

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_eXIf(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  png_bytep ppVar2;
  png_byte local_21;
  uint local_20;
  png_uint_32 pStack_1c;
  png_byte buf [1];
  uint i;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  pStack_1c = length;
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if (length < 2) {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"too short");
  }
  else if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x10000) != 0)) {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"duplicate");
  }
  else {
    info_ptr->free_me = info_ptr->free_me | 0x8000;
    ppVar2 = (png_bytep)png_malloc_warn(png_ptr,(ulong)length);
    info_ptr->eXIf_buf = ppVar2;
    if (info_ptr->eXIf_buf == (png_bytep)0x0) {
      png_crc_finish(png_ptr,pStack_1c);
      png_chunk_benign_error(png_ptr,"out of memory");
    }
    else {
      for (local_20 = 0; local_20 < pStack_1c; local_20 = local_20 + 1) {
        png_crc_read(png_ptr,&local_21,1);
        info_ptr->eXIf_buf[local_20] = local_21;
        if ((local_20 == 1) &&
           (((local_21 != 'M' && (local_21 != 'I')) || (*info_ptr->eXIf_buf != local_21)))) {
          png_crc_finish(png_ptr,pStack_1c - 2);
          png_chunk_benign_error(png_ptr,"incorrect byte-order specifier");
          png_free(png_ptr,info_ptr->eXIf_buf);
          info_ptr->eXIf_buf = (png_bytep)0x0;
          return;
        }
      }
      iVar1 = png_crc_finish(png_ptr,0);
      if (iVar1 == 0) {
        png_set_eXIf_1(png_ptr,info_ptr,pStack_1c,info_ptr->eXIf_buf);
      }
      png_free(png_ptr,info_ptr->eXIf_buf);
      info_ptr->eXIf_buf = (png_bytep)0x0;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_eXIf(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int i;

   png_debug(1, "in png_handle_eXIf");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if (length < 2)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too short");
      return;
   }

   else if (info_ptr == NULL || (info_ptr->valid & PNG_INFO_eXIf) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   info_ptr->free_me |= PNG_FREE_EXIF;

   info_ptr->eXIf_buf = png_voidcast(png_bytep,
             png_malloc_warn(png_ptr, length));

   if (info_ptr->eXIf_buf == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   for (i = 0; i < length; i++)
   {
      png_byte buf[1];
      png_crc_read(png_ptr, buf, 1);
      info_ptr->eXIf_buf[i] = buf[0];
      if (i == 1)
      {
         if ((buf[0] != 'M' && buf[0] != 'I') ||
             (info_ptr->eXIf_buf[0] != buf[0]))
         {
            png_crc_finish(png_ptr, length - 2);
            png_chunk_benign_error(png_ptr, "incorrect byte-order specifier");
            png_free(png_ptr, info_ptr->eXIf_buf);
            info_ptr->eXIf_buf = NULL;
            return;
         }
      }
   }

   if (png_crc_finish(png_ptr, 0) == 0)
      png_set_eXIf_1(png_ptr, info_ptr, length, info_ptr->eXIf_buf);

   png_free(png_ptr, info_ptr->eXIf_buf);
   info_ptr->eXIf_buf = NULL;
}